

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

void linenoise_completion(char *zLine,linenoiseCompletions *lc)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  idx_t iVar4;
  char *in_RDI;
  bool bVar5;
  int iStart;
  int nCompletion;
  char *zCompletion;
  sqlite3 *localDb;
  size_t line_pos;
  int found_match;
  char *line;
  size_t line_idx;
  char zBuf [1000];
  char *zSql;
  sqlite3_stmt *pStmt;
  int copiedSuggestion;
  idx_t nLine;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  int in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  sqlite3_stmt *in_stack_fffffffffffffbb8;
  linenoiseCompletions *in_stack_fffffffffffffbc0;
  linenoiseCompletions *lc_00;
  ulong local_438;
  ulong local_420;
  char local_418 [108];
  int in_stack_fffffffffffffc54;
  sqlite3_stmt *in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffcd4;
  sqlite3_stmt *in_stack_fffffffffffffcd8;
  sqlite3_stmt *in_stack_fffffffffffffe68;
  char **in_stack_ffffffffffffff98;
  sqlite3_stmt **in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  sqlite3 *in_stack_ffffffffffffffb8;
  
  iVar4 = duckdb_shell::ShellState::StringLength((char *)0x1e4674);
  bVar2 = false;
  if (iVar4 < 0x3cb) {
    if (*in_RDI == '.') {
      for (local_420 = 0; local_420 < 0x76; local_420 = local_420 + 1) {
        pcVar1 = azHelp[local_420];
        if (*pcVar1 == '.') {
          bVar2 = true;
          local_438 = 0;
          while( true ) {
            iVar3 = isspace((uint)(byte)pcVar1[local_438]);
            bVar5 = false;
            if ((iVar3 == 0) && (bVar5 = false, pcVar1[local_438] != '\0')) {
              bVar5 = local_438 + 1 < 1000;
            }
            if (!bVar5) goto LAB_001e47c4;
            local_418[local_438] = pcVar1[local_438];
            if ((local_438 < iVar4) && (pcVar1[local_438] != in_RDI[local_438])) break;
            local_438 = local_438 + 1;
          }
          bVar2 = false;
LAB_001e47c4:
          local_418[local_438] = '\0';
          if ((bVar2) && (iVar4 <= local_438)) {
            linenoiseAddCompletion(in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
          }
        }
      }
    }
    else if (*in_RDI != '#') {
      duckdb_shell_sqlite3_mprintf("CALL sql_auto_complete(%Q)",in_RDI);
      lc_00 = (linenoiseCompletions *)0x0;
      if (globalDb == (sqlite3 *)0x0) {
        duckdb_shell_sqlite3_open
                  ((char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (sqlite3 **)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8));
        duckdb_shell_sqlite3_prepare_v2
                  (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                   in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      else {
        duckdb_shell_sqlite3_prepare_v2
                  (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                   in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      duckdb_shell_sqlite3_free((void *)0x1e48c0);
      while (iVar3 = duckdb_shell_sqlite3_step(in_stack_fffffffffffffe68), iVar3 == 100) {
        in_stack_fffffffffffffbb8 =
             (sqlite3_stmt *)
             duckdb_shell_sqlite3_column_text(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4);
        in_stack_fffffffffffffbb4 =
             duckdb_shell_sqlite3_column_bytes(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4);
        in_stack_fffffffffffffbb0 =
             duckdb_shell_sqlite3_column_int(in_stack_fffffffffffffc58,in_stack_fffffffffffffc54);
        if (in_stack_fffffffffffffbb0 + in_stack_fffffffffffffbb4 < 999) {
          if (!bVar2) {
            memcpy(local_418,in_RDI,(long)in_stack_fffffffffffffbb0);
            bVar2 = true;
          }
          memcpy(local_418 + in_stack_fffffffffffffbb0,in_stack_fffffffffffffbb8,
                 (long)(in_stack_fffffffffffffbb4 + 1));
          linenoiseAddCompletion(lc_00,(char *)in_stack_fffffffffffffbb8);
        }
      }
      duckdb_shell_sqlite3_finalize(in_stack_fffffffffffffbb8);
      if (lc_00 != (linenoiseCompletions *)0x0) {
        duckdb_shell_sqlite3_close
                  ((sqlite3 *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      }
    }
  }
  return;
}

Assistant:

static void linenoise_completion(const char *zLine, linenoiseCompletions *lc) {
	idx_t nLine = ShellState::StringLength(zLine);
	int copiedSuggestion = 0;
	sqlite3_stmt *pStmt = 0;
	char *zSql;
	char zBuf[1000];

	if (nLine > sizeof(zBuf) - 30) {
		return;
	}
	if (zLine[0] == '.') {
		// auto-complete dot command
		// look for all completions in the help file
		size_t line_idx;
		for (line_idx = 0; line_idx < ArraySize(azHelp); line_idx++) {
			const char *line = azHelp[line_idx];
			if (line[0] != '.') {
				continue;
			}
			int found_match = 1;
			size_t line_pos;
			for (line_pos = 0; !IsSpace(line[line_pos]) && line[line_pos] && line_pos + 1 < sizeof(zBuf); line_pos++) {
				zBuf[line_pos] = line[line_pos];
				if (line_pos < nLine && line[line_pos] != zLine[line_pos]) {
					// only match prefixes for auto-completion, i.e. ".sh" matches ".shell"
					found_match = 0;
					break;
				}
			}
			zBuf[line_pos] = '\0';
			if (found_match && line_pos >= nLine) {
				linenoiseAddCompletion(lc, zBuf);
			}
		}
		return;
	}
	if (zLine[0] == '#') {
		return;
	}
	//  if( i==nLine-1 ) return;
	zSql = sqlite3_mprintf("CALL sql_auto_complete(%Q)", zLine);
	sqlite3 *localDb = NULL;
	if (!globalDb) {
		sqlite3_open(":memory:", &localDb);
		sqlite3_prepare_v2(localDb, zSql, -1, &pStmt, 0);
	} else {
		sqlite3_prepare_v2(globalDb, zSql, -1, &pStmt, 0);
	}
	sqlite3_free(zSql);
	while (sqlite3_step(pStmt) == SQLITE_ROW) {
		const char *zCompletion = (const char *)sqlite3_column_text(pStmt, 0);
		int nCompletion = sqlite3_column_bytes(pStmt, 0);
		int iStart = sqlite3_column_int(pStmt, 1);
		if (iStart + nCompletion < int(sizeof(zBuf) - 1)) {
			if (!copiedSuggestion) {
				memcpy(zBuf, zLine, iStart);
				copiedSuggestion = 1;
			}
			memcpy(zBuf + iStart, zCompletion, nCompletion + 1);
			linenoiseAddCompletion(lc, zBuf);
		}
	}
	sqlite3_finalize(pStmt);
	if (localDb) {
		sqlite3_close(localDb);
	}
}